

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casDec.c
# Opt level: O3

int CreateDecomposedNetwork
              (DdManager *dd,DdNode *aFunc,char **pNames,int nNames,char *FileName,int nLutSize,
              int fCheck,int fVerbose)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  char *pcVar4;
  char **pNames_00;
  int iVar5;
  uint uVar6;
  LUT *pLVar7;
  DdNode **ppDVar8;
  DdNode *pDVar9;
  DdNode *pDVar10;
  DdNode *n;
  int *piVar11;
  FILE *__stream;
  int iVar12;
  LUT **ppLVar13;
  ulong uVar14;
  long lVar15;
  DdNode **pbCubes;
  long lVar16;
  int iVar17;
  ulong uVar18;
  DdNode **paNodesRes;
  DdNode **pbCubesRes;
  uint uVar19;
  size_t __size;
  int iVar20;
  uint uVar21;
  timespec ts_1;
  DdNode *bVars [32];
  DdNode *bCVars [32];
  int *pSimple;
  int in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd54;
  ulong local_290;
  long local_288;
  timespec local_270;
  char *local_260;
  char **local_258;
  DdNode **local_250;
  ulong local_248;
  DdNode *local_240;
  timespec local_238 [16];
  timespec local_138 [16];
  
  s_LutSize = nLutSize;
  local_260 = FileName;
  local_240 = aFunc;
  iVar5 = clock_gettime(3,local_138);
  if (iVar5 < 0) {
    local_288 = 1;
  }
  else {
    lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_138[0].tv_nsec),8);
    local_288 = ((lVar15 >> 7) - (lVar15 >> 0x3f)) + local_138[0].tv_sec * -1000000;
  }
  local_258 = pNames;
  Extra_ProfileWidth(dd,aFunc,CreateDecomposedNetwork::Profile,-1);
  iVar5 = s_LutSize;
  local_290 = 0;
  ppLVar13 = CreateDecomposedNetwork::pLuts;
  iVar20 = nNames;
  uVar21 = 0;
  uVar2 = local_290;
  do {
    local_290 = uVar2;
    pLVar7 = (LUT *)calloc(1,0x38);
    iVar1 = uVar21 + iVar20;
    if (iVar5 < iVar1) {
      iVar17 = (uVar21 - iVar5) + iVar20;
      uVar19 = CreateDecomposedNetwork::Profile[nNames - iVar17];
      uVar6 = 0x1f;
      if (uVar19 - 1 != 0) {
        for (; uVar19 - 1 >> uVar6 == 0; uVar6 = uVar6 - 1) {
        }
      }
      iVar12 = iVar5;
      uVar6 = (uVar6 ^ 0xffffffe0) + 0x21;
      if (uVar19 < 2) {
        uVar6 = uVar19;
      }
    }
    else {
      uVar19 = 2;
      iVar17 = 0;
      iVar12 = iVar1;
      uVar6 = 1;
    }
    pLVar7->nIns = iVar12;
    pLVar7->nInsP = uVar21;
    pLVar7->nCols = uVar19;
    pLVar7->nMulti = uVar6;
    pLVar7->Level = nNames - iVar20;
    if (iVar5 <= (int)uVar6) {
      puts("The LUT size is too small");
      return 0;
    }
    __size = (long)(int)uVar19 << 3;
    ppDVar8 = (DdNode **)malloc(__size);
    pLVar7->pbCols = ppDVar8;
    ppDVar8 = (DdNode **)malloc(__size);
    pLVar7->pbCodes = ppDVar8;
    ppDVar8 = (DdNode **)malloc(__size);
    uVar2 = local_290 + 1;
    *ppLVar13 = pLVar7;
    ppLVar13 = ppLVar13 + 1;
    pLVar7->paNodes = ppDVar8;
    iVar20 = iVar17;
    uVar21 = uVar6;
  } while (iVar5 < iVar1);
  if (0 < iVar5) {
    lVar15 = 0;
    do {
      pDVar9 = Cudd_bddNewVar(dd);
      (&local_138[0].tv_sec)[lVar15] = (__time_t)pDVar9;
      lVar15 = lVar15 + 1;
    } while (lVar15 < s_LutSize);
  }
  s_EncodingTime = 0;
  local_250 = &dd->one;
  local_248 = local_290 & 0xffffffff;
  uVar14 = 0;
  uVar19 = 0;
  uVar21 = 0;
  do {
    pLVar7 = CreateDecomposedNetwork::pLuts[uVar14];
    uVar6 = (pLVar7->nIns + pLVar7->Level) - pLVar7->nInsP;
    if (uVar14 == 0) {
      pbCubesRes = pLVar7->pbCols;
      paNodesRes = pLVar7->paNodes;
      ppDVar8 = &local_240;
      iVar5 = 1;
      pbCubes = local_250;
    }
    else {
      lVar15 = (&DAT_00e22498)[uVar14];
      ppDVar8 = *(DdNode ***)(lVar15 + 0x28);
      iVar5 = *(int *)(lVar15 + 8);
      pbCubesRes = pLVar7->pbCols;
      paNodesRes = pLVar7->paNodes;
      pbCubes = *(DdNode ***)(lVar15 + 0x20);
    }
    pSimple = (int *)(ulong)uVar6;
    iVar5 = Extra_bddNodePathsUnderCutArray(dd,ppDVar8,pbCubes,iVar5,paNodesRes,pbCubesRes,uVar6);
    if (iVar5 != pLVar7->nCols) {
      __assert_fail("RetValue == p->nCols",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/cas/casDec.c"
                    ,0xf6,
                    "int CreateDecomposedNetwork(DdManager *, DdNode *, char **, int, char *, int, int, int)"
                   );
    }
    iVar5 = pLVar7->nInsP;
    if (0 < (long)iVar5) {
      piVar11 = dd->invperm;
      ppDVar8 = dd->vars;
      lVar15 = 0;
      do {
        (&local_238[0].tv_sec)[lVar15] = (__time_t)ppDVar8[piVar11[lVar15]];
        lVar15 = lVar15 + 1;
      } while (iVar5 != lVar15);
    }
    pDVar9 = Extra_bddBitsToCube(dd,~(-1 << ((byte)iVar5 & 0x1f)),iVar5,(DdNode **)local_238,1);
    Cudd_Ref(pDVar9);
    uVar6 = pLVar7->nIns - pLVar7->nInsP;
    if (uVar6 != 0 && pLVar7->nInsP <= pLVar7->nIns) {
      ppDVar8 = dd->vars;
      iVar5 = pLVar7->Level;
      piVar11 = dd->invperm;
      uVar18 = 0;
      do {
        (&local_238[0].tv_sec)[uVar18] = (__time_t)ppDVar8[piVar11[(long)iVar5 + uVar18]];
        uVar18 = uVar18 + 1;
      } while (uVar6 != uVar18);
    }
    pDVar10 = Extra_bddBitsToCube(dd,~(-1 << ((byte)uVar6 & 0x1f)),uVar6,(DdNode **)local_238,1);
    Cudd_Ref(pDVar10);
    n = Cudd_bddAnd(dd,pDVar10,pDVar9);
    Cudd_Ref(n);
    Cudd_RecursiveDeref(dd,pDVar10);
    Cudd_RecursiveDeref(dd,pDVar9);
    if (uVar14 == local_248) {
      if (pLVar7->nMulti != 1) {
        __assert_fail("p->nMulti == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/cas/casDec.c"
                      ,0x115,
                      "int CreateDecomposedNetwork(DdManager *, DdNode *, char **, int, char *, int, int, int)"
                     );
      }
      if (pLVar7->nCols != 2) {
        __assert_fail("p->nCols == 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/cas/casDec.c"
                      ,0x116,
                      "int CreateDecomposedNetwork(DdManager *, DdNode *, char **, int, char *, int, int, int)"
                     );
      }
      pDVar9 = *pLVar7->paNodes;
      if (*(int *)((ulong)pDVar9 & 0xfffffffffffffffe) != 0x7fffffff) {
        __assert_fail("Cudd_IsConstant( p->paNodes[0] )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/cas/casDec.c"
                      ,0x117,
                      "int CreateDecomposedNetwork(DdManager *, DdNode *, char **, int, char *, int, int, int)"
                     );
      }
      if (*(int *)((ulong)pLVar7->paNodes[1] & 0xfffffffffffffffe) != 0x7fffffff) {
        __assert_fail("Cudd_IsConstant( p->paNodes[1] )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/cas/casDec.c"
                      ,0x118,
                      "int CreateDecomposedNetwork(DdManager *, DdNode *, char **, int, char *, int, int, int)"
                     );
      }
      pDVar10 = (DdNode *)(local_138[0].tv_sec ^ 1);
      if (pDVar9 == dd->one) {
        pDVar10 = (DdNode *)local_138[0].tv_sec;
      }
      pDVar9 = Cudd_bddIte(dd,pDVar10,*pLVar7->pbCols,pLVar7->pbCols[1]);
      pLVar7->bRelation = pDVar9;
      Cudd_Ref(pDVar9);
    }
    else {
      iVar5 = clock_gettime(3,&local_270);
      if (iVar5 < 0) {
        lVar15 = 1;
      }
      else {
        lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_270.tv_nsec),8);
        lVar15 = ((lVar15 >> 7) - (lVar15 >> 0x3f)) + local_270.tv_sec * -1000000;
      }
      pSimple = &pLVar7->nSimple;
      pDVar9 = Extra_bddEncodingNonStrict
                         (dd,pLVar7->pbCols,pLVar7->nCols,n,(DdNode **)local_138,pLVar7->nMulti,
                          pSimple);
      pLVar7->bRelation = pDVar9;
      Cudd_Ref(pDVar9);
      iVar5 = clock_gettime(3,&local_270);
      if (iVar5 < 0) {
        lVar16 = -1;
      }
      else {
        lVar16 = local_270.tv_nsec / 1000 + local_270.tv_sec * 1000000;
      }
      s_EncodingTime = s_EncodingTime + lVar16 + lVar15;
    }
    uVar6 = pLVar7->nMulti;
    uVar3 = pLVar7->nSimple;
    if (fVerbose != 0) {
      in_stack_fffffffffffffd50 = pLVar7->Level;
      pSimple = (int *)(ulong)uVar3;
      printf("Stage %3d: In = %3d  InP = %3d  Cols = %5d  Multi = %2d  Simple = %2d  Level = %3d\n",
             (ulong)((int)uVar14 + 1),(ulong)(uint)pLVar7->nIns,(ulong)(uint)pLVar7->nInsP,
             (ulong)(uint)pLVar7->nCols,(ulong)uVar6);
    }
    if (0 < pLVar7->nCols) {
      lVar15 = 0;
      do {
        pDVar9 = Cudd_bddAndAbstract(dd,pLVar7->bRelation,pLVar7->pbCols[lVar15],n);
        pLVar7->pbCodes[lVar15] = pDVar9;
        Cudd_Ref(pLVar7->pbCodes[lVar15]);
        lVar15 = lVar15 + 1;
      } while (lVar15 < pLVar7->nCols);
    }
    Cudd_RecursiveDeref(dd,n);
    ppDVar8 = (DdNode **)malloc((long)pLVar7->nCols << 3);
    if (0 < dd->size) {
      piVar11 = CreateDecomposedNetwork::Permute;
      lVar15 = 0;
      do {
        *piVar11 = (int)lVar15;
        lVar15 = lVar15 + 1;
        piVar11 = piVar11 + 1;
      } while (lVar15 < dd->size);
    }
    if (0 < pLVar7->nMulti) {
      piVar11 = dd->invperm;
      lVar15 = 0;
      do {
        CreateDecomposedNetwork::Permute[*(uint *)(&local_138[0].tv_sec)[lVar15]] = piVar11[lVar15];
        lVar15 = lVar15 + 1;
      } while (lVar15 < pLVar7->nMulti);
    }
    Extra_bddPermuteArray(dd,pLVar7->pbCodes,ppDVar8,pLVar7->nCols,CreateDecomposedNetwork::Permute)
    ;
    if (pLVar7->nCols < 1) {
      if (ppDVar8 != (DdNode **)0x0) goto LAB_00821791;
    }
    else {
      lVar15 = 0;
      do {
        Cudd_RecursiveDeref(dd,pLVar7->pbCodes[lVar15]);
        pLVar7->pbCodes[lVar15] = ppDVar8[lVar15];
        lVar15 = lVar15 + 1;
      } while (lVar15 < pLVar7->nCols);
LAB_00821791:
      free(ppDVar8);
    }
    uVar19 = (uVar19 + uVar6) - uVar3;
    uVar21 = uVar21 + uVar6;
    uVar14 = uVar14 + 1;
    if (uVar2 == uVar14) {
      if (fVerbose != 0) {
        printf("LUTs: Total = %5d. Final = %5d. Simple = %5d. (%6.2f %%)  ",
               ((double)(int)(uVar21 - uVar19) * 100.0) / (double)(int)uVar21,(ulong)uVar21,
               (ulong)uVar19);
        printf("Memory = %6.2f MB\n",
               (double)(1 << ((byte)nLutSize & 0x1f)) * (double)(int)uVar19 * 9.5367431640625e-07);
        iVar5 = clock_gettime(3,local_238);
        if (iVar5 < 0) {
          lVar15 = -1;
        }
        else {
          lVar15 = local_238[0].tv_nsec / 1000 + local_238[0].tv_sec * 1000000;
        }
        printf("Pure decomposition time   = %.2f sec\n",
               (double)((float)((lVar15 + local_288) - s_EncodingTime) / 1e+06));
        printf("Encoding time             = %.2f sec\n",(double)((float)s_EncodingTime / 1e+06));
      }
      iVar5 = clock_gettime(3,local_238);
      pcVar4 = local_260;
      if (iVar5 < 0) {
        lVar15 = 1;
      }
      else {
        lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_238[0].tv_nsec),8);
        lVar15 = ((lVar15 >> 7) - (lVar15 >> 0x3f)) + local_238[0].tv_sec * -1000000;
      }
      if (fCheck != 0) {
        __stream = fopen(local_260,"w");
        fprintf(__stream,".model %s\n",pcVar4);
        fwrite(".inputs",7,1,__stream);
        pNames_00 = local_258;
        iVar5 = (int)pSimple;
        if (0 < nNames) {
          uVar14 = 0;
          do {
            fprintf(__stream," %s",pNames_00[uVar14]);
            iVar5 = (int)pSimple;
            uVar14 = uVar14 + 1;
          } while ((uint)nNames != uVar14);
        }
        fputc(10,__stream);
        fwrite(".outputs F",10,1,__stream);
        fputc(10,__stream);
        WriteLUTSintoBLIFfile
                  ((FILE *)__stream,dd,CreateDecomposedNetwork::pLuts,(int)uVar2,
                   (DdNode **)local_138,pNames_00,iVar5,
                   (char *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
        fwrite(".end\n",5,1,__stream);
        fclose(__stream);
        if (fVerbose != 0) {
          iVar5 = clock_gettime(3,local_238);
          if (iVar5 < 0) {
            lVar16 = -1;
          }
          else {
            lVar16 = local_238[0].tv_nsec / 1000 + local_238[0].tv_sec * 1000000;
          }
          printf("Output file writing time  = %.2f sec\n",(double)((float)(lVar16 + lVar15) / 1e+06)
                );
        }
      }
      uVar14 = 0;
      do {
        pLVar7 = CreateDecomposedNetwork::pLuts[uVar14];
        if (0 < pLVar7->nCols) {
          lVar15 = 0;
          do {
            Cudd_RecursiveDeref(dd,pLVar7->pbCols[lVar15]);
            Cudd_RecursiveDeref(dd,pLVar7->pbCodes[lVar15]);
            Cudd_RecursiveDeref(dd,pLVar7->paNodes[lVar15]);
            lVar15 = lVar15 + 1;
          } while (lVar15 < pLVar7->nCols);
        }
        Cudd_RecursiveDeref(dd,pLVar7->bRelation);
        if (pLVar7->pbCols != (DdNode **)0x0) {
          free(pLVar7->pbCols);
          pLVar7->pbCols = (DdNode **)0x0;
        }
        if (pLVar7->pbCodes != (DdNode **)0x0) {
          free(pLVar7->pbCodes);
          pLVar7->pbCodes = (DdNode **)0x0;
        }
        if (pLVar7->paNodes != (DdNode **)0x0) {
          free(pLVar7->paNodes);
        }
        free(pLVar7);
        uVar14 = uVar14 + 1;
      } while (uVar2 != uVar14);
      return 1;
    }
  } while( true );
}

Assistant:

int CreateDecomposedNetwork( DdManager * dd, DdNode * aFunc, char ** pNames, int nNames, char * FileName, int nLutSize, int fCheck, int fVerbose )
// aFunc is a 0-1 ADD for the given function
// pNames (nNames) are the input variable names
// FileName is the name of the output file for the LUT network
// dynamic variable reordering should be disabled when this function is running
{
    static LUT * pLuts[MAXINPUTS];   // the LUT cascade
    static int Profile[MAXINPUTS];   // the profile filled in with the info about the BDD width
    static int Permute[MAXINPUTS];   // the array to store a temporary permutation of variables

    LUT * p;               // the current LUT
    int i, v;

    DdNode * bCVars[32];   // these are variables for the codes

    int nVarsRem;          // the number of remaining variables
    int PrevMulti;         // column multiplicity on the previous level
    int fLastLut;          // flag to signal the last LUT
    int nLuts;
    int nLutsTotal = 0;
    int nLutOutputs = 0;
    int nLutOutputsOrig = 0;

    abctime clk1;

    s_LutSize = nLutSize;

    s_nFuncVars = nNames;

    // get the profile
    clk1 = Abc_Clock();
    Extra_ProfileWidth( dd, aFunc, Profile, -1 );


//  for ( v = 0; v < nNames; v++ )
//      printf( "Level = %2d, Width = %2d\n", v+1, Profile[v] );


//printf( "\n" );

    // mark-up the LUTs
    // assuming that the manager has exactly nNames vars (new vars have not been introduced yet)
    nVarsRem  = nNames;     // the number of remaining variables
    PrevMulti = 0;          // column multiplicity on the previous level
    fLastLut  = 0;
    nLuts     = 0;
    do
    {
        p = (LUT*) ABC_ALLOC( char, sizeof(LUT) );
        memset( p, 0, sizeof(LUT) );

        if ( nVarsRem + PrevMulti <= s_LutSize ) // this is the last LUT
        {
            p->nIns   = nVarsRem + PrevMulti;
            p->nInsP  = PrevMulti;
            p->nCols  = 2;
            p->nMulti = 1;
            p->Level  = nNames-nVarsRem;

            nVarsRem  = 0;
            PrevMulti = 1;

            fLastLut  = 1;
        }
        else // this is not the last LUT
        {
            p->nIns   = s_LutSize;
            p->nInsP  = PrevMulti;
            p->nCols  = Profile[nNames-(nVarsRem-(s_LutSize-PrevMulti))];
            p->nMulti = Abc_Base2Log(p->nCols);
            p->Level  = nNames-nVarsRem;

            nVarsRem  = nVarsRem-(s_LutSize-PrevMulti);
            PrevMulti = p->nMulti;
        }
        
        if ( p->nMulti >= s_LutSize )
        {
            printf( "The LUT size is too small\n" );
            return 0;
        }

        nLutOutputsOrig += p->nMulti;


//if ( fVerbose )
//printf( "Stage %2d: In = %3d, InP = %3d, Cols = %5d, Multi = %2d, Level = %2d\n", 
//       nLuts+1, p->nIns, p->nInsP, p->nCols, p->nMulti, p->Level );


        // there should be as many columns, codes, and nodes, as there are columns on this level
        p->pbCols  = (DdNode **) ABC_ALLOC( char, p->nCols * sizeof(DdNode *) );
        p->pbCodes = (DdNode **) ABC_ALLOC( char, p->nCols * sizeof(DdNode *) );
        p->paNodes = (DdNode **) ABC_ALLOC( char, p->nCols * sizeof(DdNode *) );

        pLuts[nLuts] = p;
        nLuts++;
    }
    while ( !fLastLut );


//if ( fVerbose )
//printf( "The number of cascades = %d\n", nLuts );


//fprintf( pTable, "%d ", nLuts );


    // add the new variables at the bottom
    for ( i = 0; i < s_LutSize; i++ )
        bCVars[i] = Cudd_bddNewVar(dd);

    // for each LUT - assign the LUT and encode the columns
    s_EncodingTime = 0;
    for ( i = 0; i < nLuts; i++ )
    {
        int RetValue;
        DdNode * bVars[32];    
        int nVars;
        DdNode * bVarsInCube;
        DdNode * bVarsCCube;
        DdNode * bVarsCube;
        int CutLevel;

        p = pLuts[i];

        // compute the columns of this LUT starting from the given set of nodes with the given codes
        // (these codes have been remapped to depend on the topmost variables in the manager)
        // for the first LUT, start with the constant 1 BDD
        CutLevel = p->Level + p->nIns - p->nInsP;
        if ( i == 0 )
            RetValue = Extra_bddNodePathsUnderCutArray( 
                            dd, &aFunc, &(b1), 1, 
                            p->paNodes, p->pbCols, CutLevel );
        else
            RetValue = Extra_bddNodePathsUnderCutArray( 
                            dd, pLuts[i-1]->paNodes, pLuts[i-1]->pbCodes, pLuts[i-1]->nCols, 
                            p->paNodes, p->pbCols, CutLevel );
        assert( RetValue == p->nCols );
        // at this point, we have filled out p->paNodes[] and p->pbCols[] of this LUT
        // pLuts[i-1]->paNodes depended on normal vars
        // pLuts[i-1]->pbCodes depended on the topmost variables 
        // the resulting p->paNodes depend on normal ADD nodes
        // the resulting p->pbCols depend on normal vars and topmost variables in the manager

        // perform the encoding

        // create the cube of these variables
        // collect the topmost variables of the manager
        nVars = p->nInsP;
        for ( v = 0; v < nVars; v++ )
            bVars[v] = dd->vars[ dd->invperm[v] ];
        bVarsCCube  = Extra_bddBitsToCube( dd, (1<<nVars)-1, nVars, bVars, 1 );    Cudd_Ref( bVarsCCube );

        // collect the primary input variables involved in this LUT
        nVars = p->nIns - p->nInsP;
        for ( v = 0; v < nVars; v++ )
            bVars[v] = dd->vars[ dd->invperm[p->Level+v] ];
        bVarsInCube = Extra_bddBitsToCube( dd, (1<<nVars)-1, nVars, bVars, 1 );    Cudd_Ref( bVarsInCube );

        // get the cube
        bVarsCube   = Cudd_bddAnd( dd, bVarsInCube, bVarsCCube );              Cudd_Ref( bVarsCube );
        Cudd_RecursiveDeref( dd, bVarsInCube );
        Cudd_RecursiveDeref( dd, bVarsCCube );

        // get the encoding relation
        if ( i == nLuts -1 )
        {
            DdNode * bVar;
            assert( p->nMulti == 1 );
            assert( p->nCols == 2 );
            assert( Cudd_IsConstant( p->paNodes[0] ) );
            assert( Cudd_IsConstant( p->paNodes[1] ) );

            bVar = ( p->paNodes[0] == a1 )? bCVars[0]: Cudd_Not( bCVars[0] );
            p->bRelation = Cudd_bddIte( dd, bVar, p->pbCols[0], p->pbCols[1] );  Cudd_Ref( p->bRelation );
        }
        else
        {
            abctime clk2 = Abc_Clock();
//          p->bRelation = PerformTheEncoding( dd, p->pbCols, p->nCols, bVarsCube, bCVars, p->nMulti, &p->nSimple );  Cudd_Ref( p->bRelation );
            p->bRelation = Extra_bddEncodingNonStrict( dd, p->pbCols, p->nCols, bVarsCube, bCVars, p->nMulti, &p->nSimple );  Cudd_Ref( p->bRelation );
            s_EncodingTime += Abc_Clock() - clk2;
        }

        // update the number of LUT outputs
        nLutOutputs += (p->nMulti - p->nSimple);
        nLutsTotal += p->nMulti;

//if ( fVerbose )
//printf( "Stage %2d: Simple = %d\n", i+1, p->nSimple );

if ( fVerbose )
printf( "Stage %3d: In = %3d  InP = %3d  Cols = %5d  Multi = %2d  Simple = %2d  Level = %3d\n", 
       i+1, p->nIns, p->nInsP, p->nCols, p->nMulti, p->nSimple, p->Level );

        // get the codes from the relation (these are not necessarily cubes)
        {
            int c;
            for ( c = 0; c < p->nCols; c++ )
            {
                p->pbCodes[c] = Cudd_bddAndAbstract( dd, p->bRelation, p->pbCols[c], bVarsCube ); Cudd_Ref( p->pbCodes[c] );
            }
        }

        Cudd_RecursiveDeref( dd, bVarsCube );

        // remap the codes to depend on the topmost varibles of the manager
        // useful as a preparation for the next step
        {
            DdNode ** pbTemp;
            int k, v;

            pbTemp = (DdNode **) ABC_ALLOC( char, p->nCols * sizeof(DdNode *) );

            // create the identical permutation
            for ( v = 0; v < dd->size; v++ )
                Permute[v] = v;

            // use the topmost variables of the manager 
            // to represent the previous level codes
            for ( v = 0; v < p->nMulti; v++ )
                Permute[bCVars[v]->index] = dd->invperm[v];

            Extra_bddPermuteArray( dd, p->pbCodes, pbTemp, p->nCols, Permute );
            // the array pbTemp comes already referenced

            // deref the old codes and assign the new ones
            for ( k = 0; k < p->nCols; k++ )
            {
                Cudd_RecursiveDeref( dd, p->pbCodes[k] );
                p->pbCodes[k] = pbTemp[k];
            }
            ABC_FREE( pbTemp );
        }
    } 
    if ( fVerbose )
    printf( "LUTs: Total = %5d. Final = %5d. Simple = %5d. (%6.2f %%)  ", 
        nLutsTotal, nLutOutputs, nLutsTotal-nLutOutputs, 100.0*(nLutsTotal-nLutOutputs)/nLutsTotal );
    if ( fVerbose )
    printf( "Memory = %6.2f MB\n", 1.0*nLutOutputs*(1<<nLutSize)/(1<<20) );
//  printf( "\n" );

//fprintf( pTable, "%d ", nLutOutputsOrig );
//fprintf( pTable, "%d ", nLutOutputs );

    if ( fVerbose )
    {
    printf( "Pure decomposition time   = %.2f sec\n", (float)(Abc_Clock() - clk1 - s_EncodingTime)/(float)(CLOCKS_PER_SEC) );
    printf( "Encoding time             = %.2f sec\n", (float)(s_EncodingTime)/(float)(CLOCKS_PER_SEC) );
//  printf( "Encoding search time      = %.2f sec\n", (float)(s_EncSearchTime)/(float)(CLOCKS_PER_SEC) );
//  printf( "Encoding compute time     = %.2f sec\n", (float)(s_EncComputeTime)/(float)(CLOCKS_PER_SEC) );
    }


//fprintf( pTable, "%.2f ", (float)(s_ReadingTime)/(float)(CLOCKS_PER_SEC) );
//fprintf( pTable, "%.2f ", (float)(Abc_Clock() - clk1 - s_EncodingTime)/(float)(CLOCKS_PER_SEC) );
//fprintf( pTable, "%.2f ", (float)(s_EncodingTime)/(float)(CLOCKS_PER_SEC) );
//fprintf( pTable, "%.2f ", (float)(s_RemappingTime)/(float)(CLOCKS_PER_SEC) );


    // write LUTs into the BLIF file
    clk1 = Abc_Clock();
    if ( fCheck )
    {
        FILE * pFile;
        // start the file
        pFile = fopen( FileName, "w" );
        fprintf( pFile, ".model %s\n", FileName );

        fprintf( pFile, ".inputs" );
        for ( i = 0; i < nNames; i++ )
            fprintf( pFile, " %s", pNames[i] );
        fprintf( pFile, "\n" );
        fprintf( pFile, ".outputs F" );
        fprintf( pFile, "\n" );

        // write the DD into the file
        WriteLUTSintoBLIFfile( pFile, dd, pLuts, nLuts, bCVars, pNames, nNames, FileName );

        fprintf( pFile, ".end\n" );
        fclose( pFile );
        if ( fVerbose )
        printf( "Output file writing time  = %.2f sec\n", (float)(Abc_Clock() - clk1)/(float)(CLOCKS_PER_SEC) );
    }


    // updo the LUT cascade
    for ( i = 0; i < nLuts; i++ )
    {
        p = pLuts[i];
        for ( v = 0; v < p->nCols; v++ )
        {
            Cudd_RecursiveDeref( dd, p->pbCols[v] );
            Cudd_RecursiveDeref( dd, p->pbCodes[v] );
            Cudd_RecursiveDeref( dd, p->paNodes[v] );
        }
        Cudd_RecursiveDeref( dd, p->bRelation );

        ABC_FREE( p->pbCols );
        ABC_FREE( p->pbCodes );
        ABC_FREE( p->paNodes );
        ABC_FREE( p );
    }

    return 1;
}